

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O1

TestStatus * __thiscall
vkt::shaderexecutor::
BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Vector<float,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_4,_4>,_tcu::Vector<float,_4>_>_>
::iterate(TestStatus *__return_storage_ptr__,
         BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Vector<float,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_4,_4>,_tcu::Vector<float,_4>_>_>
         *this)

{
  FloatFormat *pFVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  bool *pbVar3;
  qpTestLog *pqVar4;
  ostringstream *poVar5;
  _Rb_tree_node_base *p_Var6;
  double *pdVar7;
  Precision PVar8;
  Samplings<vkt::shaderexecutor::InTypes<tcu::Vector<float,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  *this_00;
  size_t sVar9;
  Statement *pSVar10;
  ShaderExecutor *pSVar11;
  Variable<tcu::Vector<float,_4>_> *pVVar12;
  pointer pcVar13;
  Variable<tcu::Matrix<float,_4,_4>_> *pVVar14;
  double dVar15;
  pointer pVVar16;
  bool bVar17;
  bool bVar18;
  int iVar19;
  _Rb_tree_node_base *p_Var20;
  long lVar21;
  long lVar22;
  IVal *pIVar23;
  IVal *pIVar24;
  undefined8 *puVar25;
  uint uVar26;
  undefined1 *puVar27;
  int row;
  string *psVar28;
  char *pcVar29;
  TestLog TVar30;
  Interval *__return_storage_ptr___00;
  long lVar31;
  byte bVar32;
  IVal in2;
  IVal in3;
  IVal in1;
  FuncSet funcs;
  FloatFormat highpFmt;
  Environment env;
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_4,_4>,_tcu::Vector<float,_4>_>_> outputs;
  void *outputArr [2];
  Inputs<vkt::shaderexecutor::InTypes<tcu::Vector<float,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  inputs;
  ostringstream oss;
  void *inputArr [4];
  IVal reference0;
  ResultCollector status;
  deUint32 in_stack_fffffffffffffa08;
  string local_5e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_5c8;
  size_t local_5c0;
  IVal *local_5b8;
  long local_5b0;
  string local_5a8;
  TestStatus *local_588;
  IVal local_580;
  long local_520;
  undefined1 local_518 [12];
  YesNoMaybe YStack_50c;
  TestLog local_508;
  _Rb_tree_node_base *local_500;
  _Rb_tree_node_base *local_4f8;
  double local_4f0;
  FloatFormat local_4b8;
  long local_488;
  FloatFormat *local_480;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  local_478;
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_4,_4>,_tcu::Vector<float,_4>_>_>
  local_448;
  pointer local_418;
  pointer local_410;
  Inputs<vkt::shaderexecutor::InTypes<tcu::Vector<float,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  local_408;
  undefined1 local_3a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_398;
  double local_388;
  Precision local_380;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  *local_378;
  undefined4 local_370;
  ios_base local_338 [8];
  ios_base local_330 [264];
  pointer local_228;
  pointer local_220;
  pointer local_218;
  pointer local_210;
  undefined1 local_200 [16];
  TestLog local_1f0 [12];
  ios_base local_190 [8];
  ios_base local_188 [264];
  ResultCollector local_80;
  
  bVar32 = 0;
  this_00 = this->m_samplings;
  pFVar1 = &(this->m_caseCtx).floatFormat;
  PVar8 = (this->m_caseCtx).precision;
  sVar9 = (this->m_caseCtx).numRandoms;
  local_588 = __return_storage_ptr__;
  iVar19 = tcu::CommandLine::getBaseSeed(((this->m_caseCtx).testContext)->m_cmdLine);
  local_480 = pFVar1;
  generateInputs<vkt::shaderexecutor::InTypes<tcu::Vector<float,4>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>
            (&local_408,(shaderexecutor *)this_00,
             (Samplings<vkt::shaderexecutor::InTypes<tcu::Vector<float,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
              *)pFVar1,(FloatFormat *)(ulong)PVar8,(Precision)sVar9,(ulong)(iVar19 + 0xdeadbeef),
             in_stack_fffffffffffffa08);
  pVVar16 = local_408.in0.
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
            _M_impl.super__Vector_impl_data._M_start;
  local_5c0 = (long)local_408.in0.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_408.in0.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4;
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_4,_4>,_tcu::Vector<float,_4>_>_>::Outputs
            (&local_448,local_5c0);
  local_4b8.m_maxValue = (this->m_caseCtx).highpFormat.m_maxValue;
  local_4b8.m_minExp = (this->m_caseCtx).highpFormat.m_minExp;
  local_4b8.m_maxExp = (this->m_caseCtx).highpFormat.m_maxExp;
  local_4b8.m_fractionBits = (this->m_caseCtx).highpFormat.m_fractionBits;
  local_4b8.m_hasSubnormal = (this->m_caseCtx).highpFormat.m_hasSubnormal;
  local_4b8.m_hasInf = (this->m_caseCtx).highpFormat.m_hasInf;
  local_4b8.m_hasNaN = (this->m_caseCtx).highpFormat.m_hasNaN;
  local_4b8.m_exactPrecision = (this->m_caseCtx).highpFormat.m_exactPrecision;
  local_4b8._25_7_ = *(undefined7 *)&(this->m_caseCtx).highpFormat.field_0x19;
  local_478._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_478._M_impl.super__Rb_tree_header._M_header;
  local_478._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_478._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_478._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_478._M_impl.super__Rb_tree_header._M_header._M_right =
       local_478._M_impl.super__Rb_tree_header._M_header._M_left;
  tcu::ResultCollector::ResultCollector(&local_80);
  local_5c8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)((this->super_TestInstance).m_context)->m_testCtx->m_log;
  local_228 = local_408.in0.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
  local_220 = local_408.in1.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_218 = local_408.in2.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_210 = local_408.in3.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_418 = local_448.out0.
              super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_410 = local_448.out1.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
  poVar5 = (ostringstream *)(local_200 + 8);
  local_200._0_8_ = local_5c8;
  std::__cxx11::ostringstream::ostringstream(poVar5);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5,"Statement: ",0xb);
  std::ostream::_M_insert<bool>(SUB81(poVar5,0));
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_200,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar5);
  std::ios_base::~ios_base(local_188);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3a8);
  p_Var6 = (_Rb_tree_node_base *)(local_518 + 8);
  local_518._8_4_ = _S_red;
  local_508.m_log = (qpTestLog *)0x0;
  local_4f0 = 0.0;
  pSVar10 = (this->m_stmt).super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_ptr;
  local_500 = p_Var6;
  local_4f8 = p_Var6;
  (*pSVar10->_vptr_Statement[4])(pSVar10,local_518);
  if (local_500 != p_Var6) {
    p_Var20 = local_500;
    do {
      (**(code **)(**(long **)(p_Var20 + 1) + 0x30))(*(long **)(p_Var20 + 1),local_3a8);
      p_Var20 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var20);
    } while (p_Var20 != p_Var6);
  }
  if (local_4f0 != 0.0) {
    poVar5 = (ostringstream *)(local_200 + 8);
    local_200._0_8_ = local_5c8;
    std::__cxx11::ostringstream::ostringstream(poVar5);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar5,"Reference definitions:\n",0x17);
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar5,(char *)local_580.m_data[0]._0_8_,(long)local_580.m_data[0].m_lo);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_200,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if ((double *)local_580.m_data[0]._0_8_ != &local_580.m_data[0].m_hi) {
      operator_delete((void *)local_580.m_data[0]._0_8_,(long)local_580.m_data[0].m_hi + 1);
    }
    std::__cxx11::ostringstream::~ostringstream(poVar5);
    std::ios_base::~ios_base(local_188);
  }
  std::
  _Rb_tree<const_vkt::shaderexecutor::FuncBase_*,_const_vkt::shaderexecutor::FuncBase_*,_std::_Identity<const_vkt::shaderexecutor::FuncBase_*>,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
  ::~_Rb_tree((_Rb_tree<const_vkt::shaderexecutor::FuncBase_*,_const_vkt::shaderexecutor::FuncBase_*,_std::_Identity<const_vkt::shaderexecutor::FuncBase_*>,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
               *)local_518);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3a8);
  std::ios_base::~ios_base(local_338);
  pSVar11 = (this->m_executor).
            super_UniqueBase<vkt::shaderexecutor::ShaderExecutor,_de::DefaultDeleter<vkt::shaderexecutor::ShaderExecutor>_>
            .m_data.ptr;
  (*pSVar11->_vptr_ShaderExecutor[2])(pSVar11,local_5c0,&local_228,&local_418,0);
  lVar21 = 0x10;
  do {
    local_3a8[lVar21 + -0x10] = 0;
    *(undefined8 *)(local_3a8 + lVar21 + -8) = 0x7ff0000000000000;
    *(undefined8 *)(local_3a8 + lVar21) = 0xfff0000000000000;
    lVar21 = lVar21 + 0x18;
  } while (lVar21 != 0x70);
  lVar21 = 0x10;
  do {
    local_3a8[lVar21 + -0x10] = 0;
    *(undefined8 *)(local_3a8 + lVar21 + -8) = 0x7ff0000000000000;
    *(undefined8 *)(local_3a8 + lVar21) = 0xfff0000000000000;
    lVar21 = lVar21 + 0x18;
  } while (lVar21 != 0x70);
  tcu::Matrix<tcu::Interval,_4,_4>::Matrix((Matrix<tcu::Interval,_4,_4> *)local_200);
  lVar21 = 0x10;
  do {
    *(undefined1 *)((long)&local_580.m_data[3].m_hi + lVar21) = 0;
    *(undefined8 *)((long)&local_520 + lVar21) = 0x7ff0000000000000;
    *(undefined8 *)(local_518 + lVar21) = 0xfff0000000000000;
    lVar21 = lVar21 + 0x18;
  } while (lVar21 != 0x70);
  lVar21 = 0x10;
  do {
    *(undefined1 *)((long)&local_580.m_data[3].m_hi + lVar21) = 0;
    *(undefined8 *)((long)&local_520 + lVar21) = 0x7ff0000000000000;
    *(undefined8 *)(local_518 + lVar21) = 0xfff0000000000000;
    lVar21 = lVar21 + 0x18;
  } while (lVar21 != 0x70);
  Environment::bind<tcu::Vector<float,4>>
            ((Environment *)&local_478,
             (this->m_variables).in0.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_4>_>_>.m_ptr,
             (IVal *)local_3a8);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_478,
             (this->m_variables).in1.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             (IVal *)&local_580);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_478,
             (this->m_variables).in2.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             (IVal *)&local_5e8);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_478,
             (this->m_variables).in3.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             (IVal *)&local_5a8);
  Environment::bind<tcu::Matrix<float,4,4>>
            ((Environment *)&local_478,
             (this->m_variables).out0.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_4,_4>_>_>.m_ptr,
             (IVal *)local_200);
  Environment::bind<tcu::Vector<float,4>>
            ((Environment *)&local_478,
             (this->m_variables).out1.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_4>_>_>.m_ptr,
             (IVal *)local_518);
  if (local_408.in0.
      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
      super__Vector_impl_data._M_finish == pVVar16) {
    local_5b8 = (IVal *)0x0;
  }
  else {
    local_488 = local_5c0 + (local_5c0 == 0);
    local_5b0 = 0;
    local_5b8 = (IVal *)0x0;
    do {
      tcu::Matrix<tcu::Interval,_4,_4>::Matrix((Matrix<tcu::Interval,_4,_4> *)local_200);
      pFVar1 = local_480;
      lVar21 = local_5b0;
      lVar22 = 0x10;
      do {
        *(undefined1 *)((long)&local_580.m_data[3].m_hi + lVar22) = 0;
        *(undefined8 *)((long)&local_520 + lVar22) = 0x7ff0000000000000;
        *(undefined8 *)(local_518 + lVar22) = 0xfff0000000000000;
        lVar22 = lVar22 + 0x18;
      } while (lVar22 != 0x70);
      lVar22 = 0x10;
      do {
        *(undefined1 *)((long)&local_580.m_data[3].m_hi + lVar22) = 0;
        *(undefined8 *)((long)&local_520 + lVar22) = 0x7ff0000000000000;
        *(undefined8 *)(local_518 + lVar22) = 0xfff0000000000000;
        lVar22 = lVar22 + 0x18;
      } while (lVar22 != 0x70);
      lVar31 = local_5b0 * 0x10;
      local_5e8._M_dataplus._M_p =
           *(pointer *)
            local_408.in0.
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
            _M_impl.super__Vector_impl_data._M_start[local_5b0].m_data;
      local_5e8._M_string_length =
           *(size_type *)
            (local_408.in0.
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_start[local_5b0].m_data + 2);
      ContainerTraits<tcu::Vector<float,_4>,_tcu::Vector<tcu::Interval,_4>_>::doRound
                (&local_580,pFVar1,(Vector<float,_4> *)&local_5e8);
      ContainerTraits<tcu::Vector<float,_4>,_tcu::Vector<tcu::Interval,_4>_>::doConvert
                ((IVal *)local_3a8,pFVar1,&local_580);
      pIVar23 = Environment::lookup<tcu::Vector<float,4>>
                          ((Environment *)&local_478,
                           (this->m_variables).in0.
                           super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_4>_>_>
                           .m_ptr);
      puVar25 = (undefined8 *)local_3a8;
      for (lVar22 = 0xc; lVar22 != 0; lVar22 = lVar22 + -1) {
        *(undefined8 *)pIVar23->m_data = *puVar25;
        puVar25 = puVar25 + (ulong)bVar32 * -2 + 1;
        pIVar23 = (IVal *)((long)pIVar23 + ((ulong)bVar32 * -2 + 1) * 8);
      }
      Environment::lookup<vkt::shaderexecutor::Void>
                ((Environment *)&local_478,
                 (this->m_variables).in1.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
                 m_ptr);
      Environment::lookup<vkt::shaderexecutor::Void>
                ((Environment *)&local_478,
                 (this->m_variables).in2.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
                 m_ptr);
      Environment::lookup<vkt::shaderexecutor::Void>
                ((Environment *)&local_478,
                 (this->m_variables).in3.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
                 m_ptr);
      local_380 = (this->m_caseCtx).precision;
      local_388 = pFVar1->m_maxValue;
      local_3a8._0_8_ = *(undefined8 *)pFVar1;
      local_3a8._8_8_ = *(undefined8 *)&pFVar1->m_fractionBits;
      local_398._M_allocated_capacity = *(undefined8 *)&pFVar1->m_hasInf;
      local_398._8_1_ = pFVar1->m_exactPrecision;
      local_398._9_3_ = *(undefined3 *)&pFVar1->field_0x19;
      local_398._12_4_ = *(undefined4 *)&pFVar1->field_0x1c;
      local_370 = 0;
      pSVar10 = (this->m_stmt).super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_ptr;
      local_378 = &local_478;
      (*pSVar10->_vptr_Statement[3])(pSVar10,(string *)local_3a8);
      pIVar23 = Environment::lookup<tcu::Vector<float,4>>
                          ((Environment *)&local_478,
                           (this->m_variables).out1.
                           super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_4>_>_>
                           .m_ptr);
      ContainerTraits<tcu::Vector<float,_4>,_tcu::Vector<tcu::Interval,_4>_>::doConvert
                ((IVal *)local_3a8,&local_4b8,pIVar23);
      psVar28 = (string *)local_3a8;
      pIVar23 = (IVal *)local_518;
      for (lVar22 = 0xc; lVar22 != 0; lVar22 = lVar22 + -1) {
        *(pointer *)pIVar23->m_data = (psVar28->_M_dataplus)._M_p;
        psVar28 = (string *)((long)psVar28 + (ulong)bVar32 * -0x10 + 8);
        pIVar23 = (IVal *)((long)pIVar23 + ((ulong)bVar32 * -2 + 1) * 8);
      }
      local_520 = lVar31;
      bVar17 = ContainerTraits<tcu::Vector<float,_4>,_tcu::Vector<tcu::Interval,_4>_>::doContains
                         ((IVal *)local_518,
                          local_448.out1.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + lVar21);
      local_3a8._0_8_ = &local_398;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_3a8,"Shader output 1 is outside acceptable range","");
      bVar17 = tcu::ResultCollector::check(&local_80,bVar17,(string *)local_3a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3a8._0_8_ != &local_398) {
        operator_delete((void *)local_3a8._0_8_,local_398._M_allocated_capacity + 1);
      }
      pIVar24 = Environment::lookup<tcu::Matrix<float,4,4>>
                          ((Environment *)&local_478,
                           (this->m_variables).out0.
                           super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_4,_4>_>_>
                           .m_ptr);
      __return_storage_ptr___00 = (Interval *)local_3a8;
      ContainerTraits<tcu::Matrix<float,_4,_4>,_tcu::Matrix<tcu::Interval,_4,_4>_>::doConvert
                ((IVal *)__return_storage_ptr___00,&local_4b8,pIVar24);
      lVar21 = local_5b0;
      puVar27 = local_200;
      lVar22 = 0;
      do {
        lVar31 = 0;
        do {
          *(undefined8 *)(puVar27 + lVar31 + 0x10) =
               *(undefined8 *)((long)&__return_storage_ptr___00->m_hi + lVar31);
          pbVar3 = &((Vector<tcu::Vector<tcu::Interval,_4>,_4> *)
                    &__return_storage_ptr___00->m_hasNaN)->m_data[0].m_data[0].m_hasNaN + lVar31;
          dVar15 = *(double *)(pbVar3 + 8);
          *(undefined8 *)(puVar27 + lVar31) = *(undefined8 *)pbVar3;
          *(double *)((long)(puVar27 + lVar31) + 8) = dVar15;
          lVar31 = lVar31 + 0x60;
        } while (lVar31 != 0x180);
        lVar22 = lVar22 + 1;
        puVar27 = puVar27 + 0x18;
        __return_storage_ptr___00 = __return_storage_ptr___00 + 1;
      } while (lVar22 != 4);
      bVar18 = contains<tcu::Matrix<float,4,4>>
                         ((IVal *)local_200,
                          local_448.out0.
                          super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + local_5b0);
      local_3a8._0_8_ = &local_398;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_3a8,"Shader output 0 is outside acceptable range","");
      bVar18 = tcu::ResultCollector::check(&local_80,bVar18,(string *)local_3a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3a8._0_8_ != &local_398) {
        operator_delete((void *)local_3a8._0_8_,local_398._M_allocated_capacity + 1);
      }
      uVar26 = (int)local_5b8 + ((byte)~(bVar17 && bVar18) & 1);
      pIVar24 = (IVal *)(ulong)uVar26;
      local_5b8 = pIVar24;
      if ((int)uVar26 < 0x65 && (!bVar17 || !bVar18)) {
        local_3a8._0_8_ = local_5c8;
        poVar5 = (ostringstream *)(local_3a8 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar5);
        pcVar29 = "Failed";
        if (bVar17 && bVar18) {
          pcVar29 = "Passed";
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5,pcVar29,6);
        pdVar7 = &local_580.m_data[0].m_hi;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5," sample:\n",9);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5,"\t",1);
        pVVar12 = (this->m_variables).in0.
                  super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_4>_>_>.
                  m_ptr;
        pcVar13 = (pVVar12->m_name)._M_dataplus._M_p;
        local_580.m_data[0]._0_8_ = pdVar7;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_580,pcVar13,pcVar13 + (pVVar12->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar5,(char *)local_580.m_data[0]._0_8_,
                   (long)local_580.m_data[0].m_lo);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5," = ",3);
        valueToString<tcu::Vector<float,4>>
                  (&local_5e8,(shaderexecutor *)&local_4b8,
                   (FloatFormat *)
                   ((long)(local_408.in0.
                           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->m_data + local_520),
                   (Vector<float,_4> *)pIVar24);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar5,local_5e8._M_dataplus._M_p,local_5e8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5e8._M_dataplus._M_p != &local_5e8.field_2) {
          operator_delete(local_5e8._M_dataplus._M_p,local_5e8.field_2._M_allocated_capacity + 1);
        }
        if ((double *)local_580.m_data[0]._0_8_ != pdVar7) {
          operator_delete((void *)local_580.m_data[0]._0_8_,(long)local_580.m_data[0].m_hi + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5,"\t",1);
        pVVar14 = (this->m_variables).out0.
                  super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_4,_4>_>_>.
                  m_ptr;
        pcVar13 = (pVVar14->m_name)._M_dataplus._M_p;
        local_580.m_data[0]._0_8_ = pdVar7;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_580,pcVar13,pcVar13 + (pVVar14->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar5,(char *)local_580.m_data[0]._0_8_,
                   (long)local_580.m_data[0].m_lo);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5," = ",3);
        valueToString<tcu::Matrix<float,4,4>>
                  (&local_5e8,(shaderexecutor *)&local_4b8,
                   (FloatFormat *)
                   (local_448.out0.
                    super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + lVar21),
                   (Matrix<float,_4,_4> *)pIVar24);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar5,local_5e8._M_dataplus._M_p,local_5e8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar5,"\tExpected range: ",0x11);
        intervalToString<tcu::Matrix<float,4,4>>
                  (&local_5a8,(shaderexecutor *)&local_4b8,(FloatFormat *)local_200,pIVar24);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar5,local_5a8._M_dataplus._M_p,local_5a8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5a8._M_dataplus._M_p != &local_5a8.field_2) {
          operator_delete(local_5a8._M_dataplus._M_p,local_5a8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5e8._M_dataplus._M_p != &local_5e8.field_2) {
          operator_delete(local_5e8._M_dataplus._M_p,local_5e8.field_2._M_allocated_capacity + 1);
        }
        if ((double *)local_580.m_data[0]._0_8_ != pdVar7) {
          operator_delete((void *)local_580.m_data[0]._0_8_,(long)local_580.m_data[0].m_hi + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5,"\t",1);
        pVVar12 = (this->m_variables).out1.
                  super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_4>_>_>.
                  m_ptr;
        pcVar13 = (pVVar12->m_name)._M_dataplus._M_p;
        local_580.m_data[0]._0_8_ = pdVar7;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_580,pcVar13,pcVar13 + (pVVar12->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar5,(char *)local_580.m_data[0]._0_8_,
                   (long)local_580.m_data[0].m_lo);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5," = ",3);
        valueToString<tcu::Vector<float,4>>
                  (&local_5e8,(shaderexecutor *)&local_4b8,
                   (FloatFormat *)
                   ((long)(local_448.out1.
                           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->m_data + local_520),
                   (Vector<float,_4> *)pIVar24);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar5,local_5e8._M_dataplus._M_p,local_5e8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar5,"\tExpected range: ",0x11);
        intervalToString<tcu::Vector<float,4>>
                  (&local_5a8,(shaderexecutor *)&local_4b8,(FloatFormat *)local_518,(IVal *)pIVar24)
        ;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar5,local_5a8._M_dataplus._M_p,local_5a8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5a8._M_dataplus._M_p != &local_5a8.field_2) {
          operator_delete(local_5a8._M_dataplus._M_p,local_5a8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5e8._M_dataplus._M_p != &local_5e8.field_2) {
          operator_delete(local_5e8._M_dataplus._M_p,local_5e8.field_2._M_allocated_capacity + 1);
        }
        if ((double *)local_580.m_data[0]._0_8_ != pdVar7) {
          operator_delete((void *)local_580.m_data[0]._0_8_,(long)local_580.m_data[0].m_hi + 1);
        }
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_3a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar5);
        std::ios_base::~ios_base(local_330);
      }
      local_5b0 = local_5b0 + 1;
    } while (local_5b0 != local_488);
  }
  iVar19 = (int)local_5b8;
  if (100 < iVar19) {
    poVar5 = (ostringstream *)(local_200 + 8);
    local_200._0_8_ = local_5c8;
    std::__cxx11::ostringstream::ostringstream(poVar5);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5,"(Skipped ",9);
    std::ostream::operator<<(poVar5,iVar19 + -100);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5," messages.)",0xb);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_200,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar5);
    std::ios_base::~ios_base(local_188);
  }
  poVar5 = (ostringstream *)(local_200 + 8);
  if (iVar19 == 0) {
    local_200._0_8_ = local_5c8;
    std::__cxx11::ostringstream::ostringstream(poVar5);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5,"All ",4);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5," inputs passed.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_200,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    local_200._0_8_ = local_5c8;
    std::__cxx11::ostringstream::ostringstream(poVar5);
    std::ostream::operator<<(poVar5,iVar19);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5,"/",1);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5," inputs failed.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_200,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream(poVar5);
  std::ios_base::~ios_base(local_188);
  if (iVar19 == 0) {
    local_200._0_8_ = local_1f0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_200,"Pass","");
    local_588->m_code = QP_TEST_RESULT_PASS;
    (local_588->m_description)._M_dataplus._M_p = (pointer)&(local_588->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_588->m_description,local_200._0_8_,
               (long)(qpTestLog **)local_200._0_8_ + local_200._8_8_);
    local_518._0_8_ = local_200._0_8_;
    if ((TestLog *)local_200._0_8_ == local_1f0) goto LAB_0099e64e;
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_200);
    std::ostream::operator<<(local_200,iVar19);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_200);
    std::ios_base::~ios_base(local_190);
    local_200._0_8_ = local_1f0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_200," test failed. Check log for the details","");
    pqVar4 = (qpTestLog *)(local_200._8_8_ + CONCAT44(YStack_50c,local_518._8_4_));
    TVar30.m_log = (qpTestLog *)0xf;
    if ((TestLog *)local_518._0_8_ != &local_508) {
      TVar30.m_log = local_508.m_log;
    }
    if (TVar30.m_log < pqVar4) {
      TVar30.m_log = (qpTestLog *)0xf;
      if ((TestLog *)local_200._0_8_ != local_1f0) {
        TVar30.m_log = local_1f0[0].m_log;
      }
      if (TVar30.m_log < pqVar4) goto LAB_0099e4d2;
      puVar25 = (undefined8 *)
                std::__cxx11::string::replace((ulong)local_200,0,(char *)0x0,local_518._0_8_);
    }
    else {
LAB_0099e4d2:
      puVar25 = (undefined8 *)std::__cxx11::string::_M_append(local_518,local_200._0_8_);
    }
    local_3a8._0_8_ = &local_398;
    paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(puVar25 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar25 == paVar2) {
      local_398._M_allocated_capacity = paVar2->_M_allocated_capacity;
      local_398._8_4_ = *(undefined4 *)(puVar25 + 3);
      local_398._12_4_ = *(undefined4 *)((long)puVar25 + 0x1c);
    }
    else {
      local_398._M_allocated_capacity = paVar2->_M_allocated_capacity;
      local_3a8._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*puVar25;
    }
    local_3a8._8_8_ = puVar25[1];
    *puVar25 = paVar2;
    puVar25[1] = 0;
    paVar2->_M_local_buf[0] = '\0';
    local_588->m_code = QP_TEST_RESULT_FAIL;
    (local_588->m_description)._M_dataplus._M_p = (pointer)&(local_588->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_588->m_description,local_3a8._0_8_,
               (char *)(local_3a8._0_8_ + local_3a8._8_8_));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a8._0_8_ != &local_398) {
      operator_delete((void *)local_3a8._0_8_,local_398._M_allocated_capacity + 1);
    }
    if ((TestLog *)local_200._0_8_ != local_1f0) {
      operator_delete((void *)local_200._0_8_,(ulong)((long)&(local_1f0[0].m_log)->flags + 1));
    }
    local_1f0[0].m_log = local_508.m_log;
    if ((TestLog *)local_518._0_8_ == &local_508) goto LAB_0099e64e;
  }
  operator_delete((void *)local_518._0_8_,(ulong)((long)&(local_1f0[0].m_log)->flags + 1));
LAB_0099e64e:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.m_message._M_dataplus._M_p != &local_80.m_message.field_2) {
    operator_delete(local_80.m_message._M_dataplus._M_p,
                    local_80.m_message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.m_prefix._M_dataplus._M_p != &local_80.m_prefix.field_2) {
    operator_delete(local_80.m_prefix._M_dataplus._M_p,
                    local_80.m_prefix.field_2._M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  ::~_Rb_tree(&local_478);
  if (local_448.out1.
      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_448.out1.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_448.out1.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_448.out1.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_448.out0.
      super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_448.out0.
                    super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_448.out0.
                          super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_448.out0.
                          super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_408.in3.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_408.in3.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_408.in3.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_408.in3.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_408.in2.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_408.in2.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_408.in2.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_408.in2.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_408.in1.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_408.in1.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_408.in1.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_408.in1.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_408.in0.
      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_408.in0.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_408.in0.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_408.in0.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return local_588;
}

Assistant:

tcu::TestStatus BuiltinPrecisionCaseTestInstance<In, Out>::iterate (void)
{
	typedef typename	In::In0		In0;
	typedef typename	In::In1		In1;
	typedef typename	In::In2		In2;
	typedef typename	In::In3		In3;
	typedef typename	Out::Out0	Out0;
	typedef typename	Out::Out1	Out1;

	Inputs<In>			inputs		= generateInputs(m_samplings, m_caseCtx.floatFormat, m_caseCtx.precision, m_caseCtx.numRandoms, 0xdeadbeefu + m_caseCtx.testContext.getCommandLine().getBaseSeed());
	const FloatFormat&	fmt			= m_caseCtx.floatFormat;
	const int			inCount		= numInputs<In>();
	const int			outCount	= numOutputs<Out>();
	const size_t		numValues	= (inCount > 0) ? inputs.in0.size() : 1;
	Outputs<Out>		outputs		(numValues);
	const FloatFormat	highpFmt	= m_caseCtx.highpFormat;
	const int			maxMsgs		= 100;
	int					numErrors	= 0;
	Environment			env;		// Hoisted out of the inner loop for optimization.
	ResultCollector		status;
	TestLog&			testLog		= m_context.getTestContext().getLog();

	const void*			inputArr[]	=
	{
		&inputs.in0.front(), &inputs.in1.front(), &inputs.in2.front(), &inputs.in3.front(),
	};
	void*				outputArr[]	=
	{
		&outputs.out0.front(), &outputs.out1.front(),
	};

	// Print out the statement and its definitions
	testLog << TestLog::Message << "Statement: " << m_stmt << TestLog::EndMessage;
	{
		ostringstream	oss;
		FuncSet			funcs;

		m_stmt->getUsedFuncs(funcs);
		for (FuncSet::const_iterator it = funcs.begin(); it != funcs.end(); ++it)
		{
			(*it)->printDefinition(oss);
		}
		if (!funcs.empty())
			testLog << TestLog::Message << "Reference definitions:\n" << oss.str()
				  << TestLog::EndMessage;
	}

	switch (inCount)
	{
		case 4: DE_ASSERT(inputs.in3.size() == numValues);
		case 3: DE_ASSERT(inputs.in2.size() == numValues);
		case 2: DE_ASSERT(inputs.in1.size() == numValues);
		case 1: DE_ASSERT(inputs.in0.size() == numValues);
		default: break;
	}

	m_executor->execute(int(numValues), inputArr, outputArr);

	// Initialize environment with dummy values so we don't need to bind in inner loop.
	{
		const typename Traits<In0>::IVal		in0;
		const typename Traits<In1>::IVal		in1;
		const typename Traits<In2>::IVal		in2;
		const typename Traits<In3>::IVal		in3;
		const typename Traits<Out0>::IVal		reference0;
		const typename Traits<Out1>::IVal		reference1;

		env.bind(*m_variables.in0, in0);
		env.bind(*m_variables.in1, in1);
		env.bind(*m_variables.in2, in2);
		env.bind(*m_variables.in3, in3);
		env.bind(*m_variables.out0, reference0);
		env.bind(*m_variables.out1, reference1);
	}

	// For each input tuple, compute output reference interval and compare
	// shader output to the reference.
	for (size_t valueNdx = 0; valueNdx < numValues; valueNdx++)
	{
		bool						result		= true;
		typename Traits<Out0>::IVal	reference0;
		typename Traits<Out1>::IVal	reference1;

		env.lookup(*m_variables.in0) = convert<In0>(fmt, round(fmt, inputs.in0[valueNdx]));
		env.lookup(*m_variables.in1) = convert<In1>(fmt, round(fmt, inputs.in1[valueNdx]));
		env.lookup(*m_variables.in2) = convert<In2>(fmt, round(fmt, inputs.in2[valueNdx]));
		env.lookup(*m_variables.in3) = convert<In3>(fmt, round(fmt, inputs.in3[valueNdx]));

		{
			EvalContext	ctx (fmt, m_caseCtx.precision, env);
			m_stmt->execute(ctx);
		}

		switch (outCount)
		{
			case 2:
				reference1 = convert<Out1>(highpFmt, env.lookup(*m_variables.out1));
				if (!status.check(contains(reference1, outputs.out1[valueNdx]),
									"Shader output 1 is outside acceptable range"))
					result = false;
			case 1:
				reference0 = convert<Out0>(highpFmt, env.lookup(*m_variables.out0));
				if (!status.check(contains(reference0, outputs.out0[valueNdx]),
									"Shader output 0 is outside acceptable range"))
					result = false;
			default: break;
		}

		if (!result)
			++numErrors;

		if ((!result && numErrors <= maxMsgs) || GLS_LOG_ALL_RESULTS)
		{
			MessageBuilder	builder	= testLog.message();

			builder << (result ? "Passed" : "Failed") << " sample:\n";

			if (inCount > 0)
			{
				builder << "\t" << m_variables.in0->getName() << " = "
						<< valueToString(highpFmt, inputs.in0[valueNdx]) << "\n";
			}

			if (inCount > 1)
			{
				builder << "\t" << m_variables.in1->getName() << " = "
						<< valueToString(highpFmt, inputs.in1[valueNdx]) << "\n";
			}

			if (inCount > 2)
			{
				builder << "\t" << m_variables.in2->getName() << " = "
						<< valueToString(highpFmt, inputs.in2[valueNdx]) << "\n";
			}

			if (inCount > 3)
			{
				builder << "\t" << m_variables.in3->getName() << " = "
						<< valueToString(highpFmt, inputs.in3[valueNdx]) << "\n";
			}

			if (outCount > 0)
			{
				builder << "\t" << m_variables.out0->getName() << " = "
						<< valueToString(highpFmt, outputs.out0[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out0>(highpFmt, reference0) << "\n";
			}

			if (outCount > 1)
			{
				builder << "\t" << m_variables.out1->getName() << " = "
						<< valueToString(highpFmt, outputs.out1[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out1>(highpFmt, reference1) << "\n";
			}

			builder << TestLog::EndMessage;
		}
	}

	if (numErrors > maxMsgs)
	{
		testLog << TestLog::Message << "(Skipped " << (numErrors - maxMsgs) << " messages.)"
			  << TestLog::EndMessage;
	}

	if (numErrors == 0)
	{
		testLog << TestLog::Message << "All " << numValues << " inputs passed."
			  << TestLog::EndMessage;
	}
	else
	{
		testLog << TestLog::Message << numErrors << "/" << numValues << " inputs failed."
			  << TestLog::EndMessage;
	}

	if (numErrors)
		return tcu::TestStatus::fail(de::toString(numErrors) + string(" test failed. Check log for the details"));
	else
		return tcu::TestStatus::pass("Pass");

}